

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment.cpp
# Opt level: O1

bool pstore::repo::fragment::fragment_appears_valid
               (fragment *f,extent<pstore::repo::fragment> *fext)

{
  ulong offset;
  indices iVar1;
  uint uVar2;
  unsigned_long *puVar3;
  uint64_t *puVar4;
  ulong uVar5;
  ulong pos;
  size_t size;
  ulong min_offset;
  byte bVar6;
  member_array *sa;
  bool bVar7;
  bool bVar8;
  const_iterator cVar9;
  indices indices;
  iterator index_it;
  indices local_54;
  const_iterator local_50;
  byte local_40;
  uint64_t *local_38;
  
  if (((*(long *)(f->signature_)._M_elems == 0x746e656d67617246) &&
      (local_54.bitmap_ = (f->arr_).sa_.bitmap_, local_54.bitmap_ != 0)) &&
     (uVar2 = sparse_array<unsigned_long,_unsigned_int>::indices::back(&local_54),
     iVar1.bitmap_ = local_54.bitmap_, (byte)uVar2 < 0x13)) {
    if ((ulong)local_54.bitmap_ == 0) {
      uVar2 = 0;
      local_50.bitmap_ = local_54.bitmap_;
    }
    else {
      uVar2 = bit_count::ctz((ulong)local_54.bitmap_);
      local_50.bitmap_ = iVar1.bitmap_ >> ((byte)uVar2 & 0x1f);
    }
    local_50.pos_ = (size_t)uVar2;
    bVar7 = local_50.bitmap_ == 0;
    if (!bVar7) {
      sa = &f->arr_;
      local_38 = &fext->size;
      min_offset = 0x20;
      do {
        bVar6 = (byte)local_50.pos_;
        pos = local_50.pos_ & 0xff;
        local_40 = bVar6;
        puVar3 = sparse_array<unsigned_long,unsigned_int>::
                 index_impl<pstore::sparse_array<unsigned_long,unsigned_int>const&,unsigned_long_const>
                           (&sa->sa_,pos);
        offset = *puVar3;
        uVar2 = sparse_array<unsigned_long,_unsigned_int>::indices::back(&local_54);
        puVar4 = local_38;
        if (bVar6 != (byte)uVar2) {
          cVar9 = sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator::operator+
                            (&local_50,1);
          puVar4 = sparse_array<unsigned_long,unsigned_int>::
                   index_impl<pstore::sparse_array<unsigned_long,unsigned_int>const&,unsigned_long_const>
                             (&sa->sa_,(ulong)(byte)cVar9.pos_);
        }
        bVar8 = false;
        if (min_offset <= offset) {
          uVar5 = *puVar4;
          size = uVar5 - offset;
          bVar8 = false;
          if (offset <= uVar5 && size != 0) {
            if ((0x1f < bVar6) || ((1 << (bVar6 & 0x1f) & (sa->sa_).bitmap_) == 0)) {
              assert_failed("f.has_section (kind)",
                            "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/fragment.cpp"
                            ,0x96);
            }
            switch(pos) {
            case 0:
              min_offset = section_offset_is_valid<(pstore::repo::section_kind)0,pstore::repo::generic_section>
                                     (f,fext,min_offset,offset,size);
              break;
            case 1:
              min_offset = section_offset_is_valid<(pstore::repo::section_kind)1,pstore::repo::generic_section>
                                     (f,fext,min_offset,offset,size);
              break;
            case 2:
              if (size < 8) {
                min_offset = 0;
              }
              else {
                min_offset = 0;
                if (((int)(fext->addr).a_.a_ + (int)offset & 7U) == 0) {
                  if (fext->size - size < offset) {
                    uVar5 = 0;
                  }
                  min_offset = uVar5;
                  if (fext->size < size) {
                    min_offset = 0;
                  }
                }
              }
              break;
            case 3:
              min_offset = section_offset_is_valid<(pstore::repo::section_kind)3,pstore::repo::generic_section>
                                     (f,fext,min_offset,offset,size);
              break;
            case 4:
              min_offset = section_offset_is_valid<(pstore::repo::section_kind)4,pstore::repo::generic_section>
                                     (f,fext,min_offset,offset,size);
              break;
            case 5:
              min_offset = section_offset_is_valid<(pstore::repo::section_kind)5,pstore::repo::generic_section>
                                     (f,fext,min_offset,offset,size);
              break;
            case 6:
              min_offset = section_offset_is_valid<(pstore::repo::section_kind)6,pstore::repo::generic_section>
                                     (f,fext,min_offset,offset,size);
              break;
            case 7:
              min_offset = section_offset_is_valid<(pstore::repo::section_kind)7,pstore::repo::generic_section>
                                     (f,fext,min_offset,offset,size);
              break;
            case 8:
              min_offset = section_offset_is_valid<(pstore::repo::section_kind)8,pstore::repo::generic_section>
                                     (f,fext,min_offset,offset,size);
              break;
            case 9:
              min_offset = section_offset_is_valid<(pstore::repo::section_kind)9,pstore::repo::generic_section>
                                     (f,fext,min_offset,offset,size);
              break;
            case 10:
              min_offset = section_offset_is_valid<(pstore::repo::section_kind)10,pstore::repo::generic_section>
                                     (f,fext,min_offset,offset,size);
              break;
            case 0xb:
              min_offset = section_offset_is_valid<(pstore::repo::section_kind)11,pstore::repo::generic_section>
                                     (f,fext,min_offset,offset,size);
              break;
            case 0xc:
              min_offset = section_offset_is_valid<(pstore::repo::section_kind)12,pstore::repo::generic_section>
                                     (f,fext,min_offset,offset,size);
              break;
            case 0xd:
              min_offset = section_offset_is_valid<(pstore::repo::section_kind)13,pstore::repo::generic_section>
                                     (f,fext,min_offset,offset,size);
              break;
            case 0xe:
              min_offset = section_offset_is_valid<(pstore::repo::section_kind)14,pstore::repo::debug_line_section>
                                     (f,fext,min_offset,offset,size);
              break;
            case 0xf:
              min_offset = section_offset_is_valid<(pstore::repo::section_kind)15,pstore::repo::generic_section>
                                     (f,fext,min_offset,offset,size);
              break;
            case 0x10:
              min_offset = section_offset_is_valid<(pstore::repo::section_kind)16,pstore::repo::generic_section>
                                     (f,fext,min_offset,offset,size);
              break;
            case 0x11:
              min_offset = section_offset_is_valid<(pstore::repo::section_kind)17,pstore::repo::generic_section>
                                     (f,fext,min_offset,offset,size);
              break;
            case 0x12:
              min_offset = section_offset_is_valid<(pstore::repo::section_kind)18,pstore::repo::linked_definitions>
                                     (f,fext,min_offset,offset,size);
              break;
            case 0x13:
              assert_failed("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/fragment.cpp"
                            ,0x9f);
            }
            bVar8 = min_offset != 0;
          }
        }
        if (!bVar8) {
          return bVar7;
        }
        uVar2 = local_50.bitmap_ >> 1;
        local_50.pos_ = local_50.pos_ + 1;
        bVar7 = 1 < local_50.bitmap_;
        local_50.bitmap_ = uVar2;
        if (bVar7) {
          uVar2 = bit_count::ctz((ulong)uVar2);
          local_50.bitmap_ = local_50.bitmap_ >> ((byte)uVar2 & 0x1f);
          local_50.pos_ = local_50.pos_ + uVar2;
        }
        bVar7 = local_50.bitmap_ == 0;
      } while (!bVar7);
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool fragment::fragment_appears_valid (fragment const & f, pstore::extent<fragment> const & fext) {
#if PSTORE_SIGNATURE_CHECKS_ENABLED
    if (f.signature_ != fragment_signature_) {
        return false;
    }
#endif // PSTORE_SIGNATURE_CHECKS_ENABLED

    auto const indices = f.arr_.get_indices ();
    if (indices.empty () || indices.back () >= section_kind::last) {
        return false;
    }

    std::uint64_t offset = sizeof (fragment);
    for (auto index_it = std::begin (indices), index_end = std::end (indices);
         index_it != index_end; ++index_it) {
        section_kind const index = *index_it;

        auto const this_offset = f.arr_[index];
        auto const next_offset = (index == indices.back ()) ? fext.size : f.arr_[*(index_it + 1)];
        if (this_offset < offset || next_offset <= this_offset) {
            return false;
        }

        section_kind const kind = static_cast<section_kind> (index);
        PSTORE_ASSERT (f.has_section (kind));
#define X(k)                                                                                       \
    case section_kind::k:                                                                          \
        offset = fragment::section_offset_is_valid<section_kind::k> (f, fext, offset, this_offset, \
                                                                     next_offset - this_offset);   \
        break;

        switch (kind) {
            PSTORE_MCREPO_SECTION_KINDS
        case repo::section_kind::last: PSTORE_ASSERT (false); break;
        }
#undef X
        if (offset == 0) {
            return false;
        }
    }

    return true;
}